

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O3

word Gia_ManAutomSim0(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wrd_t *vTemp)

{
  Gia_Obj_t *pGVar1;
  word wVar2;
  uint uVar3;
  
  uVar3 = *(uint *)pObj;
  pGVar1 = p->pObjs;
  if ((uVar3 >> 0x1d & 1) == 0) {
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
LAB_0074f9a4:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar3 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555 - (uVar3 & 0x1fffffff);
    if (((int)uVar3 < 0) || (vTemp->nSize <= (int)uVar3)) {
LAB_0074f9c3:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    wVar2 = vTemp->pArray[uVar3];
  }
  else {
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_0074f9a4;
    uVar3 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555 - (uVar3 & 0x1fffffff);
    if (((int)uVar3 < 0) || (vTemp->nSize <= (int)uVar3)) goto LAB_0074f9c3;
    wVar2 = ~vTemp->pArray[uVar3];
  }
  return wVar2;
}

Assistant:

static inline word Gia_ManAutomSim0( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wrd_t * vTemp )
{
    return Gia_ObjFaninC0(pObj) ? ~Vec_WrdEntry(vTemp, Gia_ObjFaninId0p(p, pObj)) : Vec_WrdEntry(vTemp, Gia_ObjFaninId0p(p, pObj));
}